

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O1

void elf32_makestrtab(void)

{
  unsigned_long uVar1;
  
  elf32_addshdr(elfstrtabidx,3,0,0,elfoffset,elfstringlist.nextindex,0,0,1,0,
                (uint)(elf_endianess == '\x01'));
  elfoffset = elfoffset + elfstringlist.nextindex;
  uVar1 = align((ulong)elfoffset,2);
  elfoffset = elfoffset + (int)uVar1;
  return;
}

Assistant:

static void elf32_makestrtab(void)
/* creates .strtab */
{
  bool be = elf_endianess == _BIG_ENDIAN_;

  elf32_addshdr(elfstrtabidx,SHT_STRTAB,0,0,elfoffset,
                elfstringlist.nextindex,0,0,1,0,be);
  elfoffset += elfstringlist.nextindex;
  elfoffset += align(elfoffset,2);
}